

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Table * sqlite3SrcListLookup(Parse *pParse,SrcList *pSrc)

{
  undefined1 *puVar1;
  Table *pTable;
  int iVar2;
  Table *pTVar3;
  
  pTVar3 = sqlite3LocateTableItem(pParse,0,pSrc->a);
  pTable = pSrc->a[0].pSTab;
  if (pTable != (Table *)0x0) {
    sqlite3DeleteTable(pParse->db,pTable);
  }
  pSrc->a[0].pSTab = pTVar3;
  puVar1 = &pSrc->a[0].fg.field_0x2;
  *puVar1 = *puVar1 | 4;
  if (pTVar3 == (Table *)0x0) {
    pTVar3 = (Table *)0x0;
  }
  else {
    pTVar3->nTabRef = pTVar3->nTabRef + 1;
    if ((pSrc->a[0].fg.field_0x1 & 2) != 0) {
      iVar2 = sqlite3IndexedByLookup(pParse,pSrc->a);
      if (iVar2 != 0) {
        pTVar3 = (Table *)0x0;
      }
    }
  }
  return pTVar3;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3SrcListLookup(Parse *pParse, SrcList *pSrc){
  SrcItem *pItem = pSrc->a;
  Table *pTab;
  assert( pItem && pSrc->nSrc>=1 );
  pTab = sqlite3LocateTableItem(pParse, 0, pItem);
  if( pItem->pSTab ) sqlite3DeleteTable(pParse->db, pItem->pSTab);
  pItem->pSTab = pTab;
  pItem->fg.notCte = 1;
  if( pTab ){
    pTab->nTabRef++;
    if( pItem->fg.isIndexedBy && sqlite3IndexedByLookup(pParse, pItem) ){
      pTab = 0;
    }
  }
  return pTab;
}